

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

Pla_Man_t * Pla_ManGenerate(int nInputs,int nOutputs,int nCubes,int fVerbose)

{
  int iVar1;
  Pla_Man_t *p_00;
  Vec_Bit_t *pVVar2;
  Pla_Lit_t PVar3;
  char local_428 [8];
  char Buffer [1000];
  word *pCube;
  int local_30;
  int Count;
  int k;
  int i;
  Vec_Bit_t *vBits;
  Pla_Man_t *p;
  int fVerbose_local;
  int nCubes_local;
  int nOutputs_local;
  int nInputs_local;
  
  sprintf(local_428,"%s_%d_%d_%d","rand",(ulong)(uint)nInputs,(ulong)(uint)nOutputs,
          (ulong)(uint)nCubes);
  p_00 = Pla_ManAlloc(local_428,nInputs,nOutputs,nCubes);
  pVVar2 = Pla_GenRandom(nInputs,nCubes,0);
  pCube._4_4_ = 0;
  for (Count = 0; iVar1 = Vec_BitSize(pVVar2), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_BitEntry(pVVar2,Count);
    if (iVar1 != 0) {
      iVar1 = pCube._4_4_ + 1;
      Buffer._992_8_ = Pla_CubeIn(p_00,pCube._4_4_);
      for (local_30 = 0; pCube._4_4_ = iVar1, local_30 < nInputs; local_30 = local_30 + 1) {
        PVar3 = PLA_LIT_ZERO;
        if ((Count >> ((byte)local_30 & 0x1f) & 1U) != 0) {
          PVar3 = PLA_LIT_ONE;
        }
        Pla_CubeSetLit((word *)Buffer._992_8_,local_30,PVar3);
      }
    }
  }
  if (pCube._4_4_ != nCubes) {
    __assert_fail("Count == nCubes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaMan.c"
                  ,0xba,"Pla_Man_t *Pla_ManGenerate(int, int, int, int)");
  }
  Vec_BitFree(pVVar2);
  if (nOutputs < 2) {
    for (Count = 0; iVar1 = Pla_ManCubeNum(p_00), Count < iVar1; Count = Count + 1) {
      Buffer._992_8_ = Pla_CubeOut(p_00,Count);
      Pla_CubeSetLit((word *)Buffer._992_8_,0,PLA_LIT_ONE);
    }
  }
  else {
    pVVar2 = Pla_GenRandom(nOutputs,nCubes,1);
    pCube._4_4_ = 0;
    for (Count = 0; iVar1 = Vec_BitSize(pVVar2), Count < iVar1; Count = Count + 1) {
      iVar1 = Vec_BitEntry(pVVar2,Count);
      if (iVar1 != 0) {
        iVar1 = pCube._4_4_ + 1;
        Buffer._992_8_ = Pla_CubeOut(p_00,pCube._4_4_);
        for (local_30 = 0; pCube._4_4_ = iVar1, local_30 < nOutputs; local_30 = local_30 + 1) {
          PVar3 = PLA_LIT_ZERO;
          if ((Count >> ((byte)local_30 & 0x1f) & 1U) != 0) {
            PVar3 = PLA_LIT_ONE;
          }
          Pla_CubeSetLit((word *)Buffer._992_8_,local_30,PVar3);
        }
      }
    }
    if (pCube._4_4_ != nCubes) {
      __assert_fail("Count == nCubes",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaMan.c"
                    ,199,"Pla_Man_t *Pla_ManGenerate(int, int, int, int)");
    }
    Vec_BitFree(pVVar2);
  }
  return p_00;
}

Assistant:

Pla_Man_t * Pla_ManGenerate( int nInputs, int nOutputs, int nCubes, int fVerbose )
{
    Pla_Man_t * p;
    Vec_Bit_t * vBits;
    int i, k, Count;
    word * pCube;
    char Buffer[1000];
    sprintf( Buffer, "%s_%d_%d_%d", "rand", nInputs, nOutputs, nCubes );
    p = Pla_ManAlloc( Buffer, nInputs, nOutputs, nCubes );
    // generate nCube random input minterms
    vBits = Pla_GenRandom( nInputs, nCubes, 0 );
    for ( i = Count = 0; i < Vec_BitSize(vBits); i++ )
        if ( Vec_BitEntry(vBits, i) )
        {
            pCube = Pla_CubeIn( p, Count++ );
            for ( k = 0; k < nInputs; k++ )
                Pla_CubeSetLit( pCube, k, ((i >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
        }
    assert( Count == nCubes );
    Vec_BitFree( vBits );
    // generate nCube random output minterms
    if ( nOutputs > 1 )
    {
        vBits = Pla_GenRandom( nOutputs, nCubes, 1 );
        for ( i = Count = 0; i < Vec_BitSize(vBits); i++ )
            if ( Vec_BitEntry(vBits, i) )
            {
                pCube = Pla_CubeOut( p, Count++ );
                for ( k = 0; k < nOutputs; k++ )
                    Pla_CubeSetLit( pCube, k, ((i >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
            }
        assert( Count == nCubes );
        Vec_BitFree( vBits );
    }
    else
    {
        Pla_ForEachCubeOut( p, pCube, i )
            Pla_CubeSetLit( pCube, 0, PLA_LIT_ONE );
    }
    return p;
}